

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

EAMType __thiscall OpenMD::EAMAdapter::getEAMType(EAMAdapter *this)

{
  EAMParameters eamParam;
  undefined1 local_38 [48];
  
  getEAMParam((EAMParameters *)local_38,this);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  return local_38._0_4_;
}

Assistant:

EAMType EAMAdapter::getEAMType() {
    EAMParameters eamParam = getEAMParam();
    return eamParam.eamType;
  }